

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiveProxy.cpp
# Opt level: O0

void __thiscall
aeron::archive::ArchiveProxy::ArchiveProxy
          (ArchiveProxy *this,shared_ptr<aeron::ExclusivePublication> *publication,
          int64_t connectTimeoutNs,int32_t retryAttempts)

{
  reference buffer;
  size_type length;
  int64_t iStack_20;
  int32_t retryAttempts_local;
  int64_t connectTimeoutNs_local;
  shared_ptr<aeron::ExclusivePublication> *publication_local;
  ArchiveProxy *this_local;
  
  iStack_20 = connectTimeoutNs;
  connectTimeoutNs_local = (int64_t)publication;
  publication_local = &this->publication_;
  std::shared_ptr<aeron::ExclusivePublication>::shared_ptr(&this->publication_,publication);
  concurrent::YieldingIdleStrategy::YieldingIdleStrategy((YieldingIdleStrategy *)&this->field_0x10);
  buffer = std::array<unsigned_char,_4096UL>::operator[](&this->underlyingBuffer_,0);
  length = std::array<unsigned_char,_4096UL>::size(&this->underlyingBuffer_);
  concurrent::AtomicBuffer::AtomicBuffer(&this->buffer_,buffer,length);
  std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,void>
            ((duration<long,std::ratio<1l,1000000000l>> *)&this->connectTimeoutNs_,
             &stack0xffffffffffffffe0);
  this->retryAttempts_ = retryAttempts;
  return;
}

Assistant:

ArchiveProxy::ArchiveProxy(const std::shared_ptr<aeron::ExclusivePublication>& publication,
                           std::int64_t connectTimeoutNs, std::int32_t retryAttempts)
    : publication_(publication)
    , buffer_(&underlyingBuffer_[0], underlyingBuffer_.size())
    , connectTimeoutNs_(connectTimeoutNs)
    , retryAttempts_(retryAttempts) {}